

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int *piVar8;
  void *pvVar9;
  Mat *pMVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int j_1;
  ulong uVar19;
  int j;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  void *pvVar25;
  int l;
  int iVar26;
  int iVar27;
  void *pvVar28;
  ulong uVar29;
  int iVar30;
  void *pvVar31;
  int iVar32;
  long lVar33;
  int i;
  int iVar34;
  void *pvVar35;
  ulong uVar36;
  size_type __n;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  void *local_1d0;
  allocator_type local_1c1;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  size_t local_1a8;
  void *local_1a0;
  void *local_198;
  float *local_190;
  undefined8 local_188;
  void *local_180;
  ulong local_178;
  ulong local_170;
  void *local_168;
  void *local_160;
  ulong local_158;
  ulong local_150;
  long local_148;
  long local_140;
  ulong local_138;
  void *local_130;
  int local_124;
  Mat *local_120;
  Mat local_118;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  long local_a8;
  long local_a0;
  ulong local_98;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  
  uVar2 = bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  iVar15 = this->kernel_w;
  iVar14 = this->dilation_w;
  iVar32 = this->kernel_h;
  iVar3 = this->dilation_h;
  iVar13 = this->kernel_d;
  iVar23 = this->dilation_d;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  opt_pad.lightmode = opt->lightmode;
  opt_pad.use_shader_pack8 = opt->use_shader_pack8;
  opt_pad.use_subgroup_ops = opt->use_subgroup_ops;
  opt_pad.use_reserved_0 = opt->use_reserved_0;
  opt_pad.num_threads = opt->num_threads;
  opt_pad.blob_allocator = opt->blob_allocator;
  opt_pad.workspace_allocator = opt->workspace_allocator;
  opt_pad.openmp_blocktime = opt->openmp_blocktime;
  opt_pad.use_winograd_convolution = opt->use_winograd_convolution;
  opt_pad.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_pad.use_int8_inference = opt->use_int8_inference;
  opt_pad.use_vulkan_compute = opt->use_vulkan_compute;
  uVar19._0_1_ = opt->use_bf16_storage;
  uVar19._1_1_ = opt->use_fp16_packed;
  uVar19._2_1_ = opt->use_fp16_storage;
  uVar19._3_1_ = opt->use_fp16_arithmetic;
  uVar19._4_1_ = opt->use_int8_packed;
  uVar19._5_1_ = opt->use_int8_storage;
  uVar19._6_1_ = opt->use_int8_arithmetic;
  uVar19._7_1_ = opt->use_packing_layout;
  opt_pad.vulkan_device_index = opt->vulkan_device_index;
  opt_pad.use_reserved_1 = opt->use_reserved_1;
  opt_pad.use_image_storage = opt->use_image_storage;
  opt_pad.use_tensor_storage = opt->use_tensor_storage;
  opt_pad.use_reserved_2 = opt->use_reserved_2;
  opt_pad.flush_denormals = opt->flush_denormals;
  opt_pad.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_pad.use_shader_local_memory = opt->use_shader_local_memory;
  opt_pad.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_pad.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_pad.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_pad.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_pad.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
  opt_pad.use_fp16_uniform = opt->use_fp16_uniform;
  opt_pad.use_int8_uniform = opt->use_int8_uniform;
  opt_pad.use_reserved_9 = opt->use_reserved_9;
  opt_pad.use_reserved_10 = opt->use_reserved_10;
  opt_pad.use_reserved_11 = opt->use_reserved_11;
  opt_pad._32_8_ = uVar19 & 0xffffffffffffff;
  local_120 = top_blob;
  make_padding(this,bottom_blob,&local_118,&opt_pad);
  iVar11 = local_118.h;
  local_188 = 0xffffffffffffff9c;
  if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0)) {
    local_1b0 = (void *)CONCAT44(local_1b0._4_4_,local_118.w);
    uVar19 = (long)(~((iVar15 + -1) * iVar14) + local_118.w) / (long)this->stride_w;
    uVar16 = (long)(~((iVar32 + -1) * iVar3) + local_118.h) / (long)this->stride_h;
    uVar21 = uVar16 & 0xffffffff;
    uVar36 = (long)(~((iVar13 + -1) * iVar23) + local_118.d) / (long)this->stride_d;
    uVar12 = this->kernel_w * this->kernel_h * this->kernel_d;
    __n = (size_type)(int)uVar12;
    local_1a8 = sVar4;
    local_198 = (void *)(ulong)uVar2;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,&local_1c1);
    pMVar10 = local_120;
    iVar13 = (int)uVar19 + 1;
    iVar15 = this->dilation_h;
    iVar14 = this->kernel_w;
    iVar32 = this->kernel_h;
    iVar26 = this->dilation_w * iVar14;
    iVar3 = this->dilation_d;
    iVar23 = iVar15 * iVar32;
    iVar27 = 0;
    iVar30 = 0;
    for (iVar24 = 0; iVar24 < this->kernel_d; iVar24 = iVar24 + 1) {
      for (iVar34 = 0; iVar34 < iVar32; iVar34 = iVar34 + 1) {
        for (lVar33 = 0; (int)lVar33 < iVar14; lVar33 = lVar33 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar30 + lVar33] = iVar27;
          iVar27 = iVar27 + this->dilation_w;
          iVar14 = this->kernel_w;
        }
        iVar30 = iVar30 + (int)lVar33;
        iVar27 = iVar27 + (iVar15 * (int)local_1b0 - iVar26);
        iVar32 = this->kernel_h;
      }
      iVar27 = iVar27 + (iVar11 * iVar3 - iVar23) * (int)local_1b0;
    }
    local_1b8 = (void *)(uVar19 & 0xffffffff);
    local_158 = uVar36 & 0xffffffff;
    Mat::create(local_120,iVar13,(int)uVar16 + 1,(int)uVar36 + 1,this->num_output,local_1a8,
                opt->blob_allocator);
    local_160 = pMVar10->data;
    local_188 = 0xffffffffffffff9c;
    if ((local_160 != (void *)0x0) &&
       (local_1a0 = (void *)pMVar10->cstep, (long)pMVar10->c * (long)local_1a0 != 0)) {
      uVar2 = this->group;
      uVar22 = (uint)local_198;
      if (uVar2 == this->num_output && uVar22 == uVar2) {
        local_1a0 = (void *)((long)local_1a0 * pMVar10->elemsize);
        pvVar35 = (this->weight_data).data;
        local_168 = local_118.data;
        local_170 = local_118.cstep *
                    CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
        local_140 = (long)local_118.w *
                    CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
        local_148 = local_118.h * local_140;
        local_150 = (ulong)iVar13;
        uVar19 = 0;
        if (0 < (int)uVar12) {
          uVar19 = (ulong)uVar12;
        }
        pvVar25 = (void *)(long)(int)local_1b8;
        local_188 = 0;
        local_198 = (void *)((ulong)local_198 & 0xffffffff);
        if ((int)uVar22 < 1) {
          local_198 = (void *)0x0;
        }
        local_180 = pvVar25;
        local_138 = uVar21;
        for (pvVar28 = (void *)0x0; pvVar28 != local_198; pvVar28 = (void *)((long)pvVar28 + 1)) {
          pvVar31 = (void *)((long)local_1a0 * (long)pvVar28 + (long)local_160);
          local_130 = (void *)(local_170 * (long)pvVar28 + (long)local_168);
          local_1c0 = pvVar28;
          for (iVar15 = 0; iVar15 <= (int)local_158; iVar15 = iVar15 + 1) {
            local_c8._0_4_ = iVar15;
            iVar14 = 0;
            while (pvVar9 = local_130, iVar14 <= (int)uVar21) {
              iVar32 = this->bias_term;
              iVar3 = this->activation_type;
              local_1b0 = (this->bias_data).data;
              lVar33 = (long)iVar15 * (long)this->stride_d * local_148;
              local_190 = (float *)CONCAT44(local_190._4_4_,iVar14);
              lVar18 = (long)iVar14 * (long)this->stride_h * local_140;
              local_1a8 = (size_t)this->stride_w;
              pfVar5 = (float *)(this->activation_params).data;
              local_178 = CONCAT44(local_178._4_4_,iVar32);
              local_1b8 = pvVar31;
              for (lVar20 = 0; lVar20 <= (long)pvVar25; lVar20 = lVar20 + 1) {
                if (iVar32 == 0) {
                  auVar40 = ZEXT812(0);
                }
                else {
                  auVar40._4_8_ = 0;
                  auVar40._0_4_ = *(uint *)((long)local_1b0 + (long)pvVar28 * 4);
                }
                auVar42._12_4_ = 0;
                auVar42._0_12_ = auVar40;
                uVar16 = 0;
                while( true ) {
                  fVar37 = auVar42._0_4_;
                  if (uVar19 == uVar16) break;
                  auVar42._0_4_ =
                       fVar37 + *(float *)((long)pvVar35 + uVar16 * 4) *
                                *(float *)((long)pvVar9 +
                                          (long)_space_ofs.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar16] * 4
                                          + lVar20 * local_1a8 * 4 + lVar18 + lVar33);
                  uVar16 = uVar16 + 1;
                }
                switch(iVar3) {
                case 1:
                  if (fVar37 <= 0.0) {
                    auVar6._12_4_ = 0;
                    auVar6._0_12_ = auVar42._4_12_;
                    auVar42 = auVar6 << 0x20;
                  }
                default:
switchD_004db89c_default:
                  fVar38 = auVar42._0_4_;
                  break;
                case 2:
                  fVar38 = (float)(~-(uint)(0.0 < fVar37) & (uint)*pfVar5 |
                                  -(uint)(0.0 < fVar37) & 0x3f800000) * fVar37;
                  break;
                case 3:
                  if (fVar37 <= *pfVar5) {
                    auVar42._0_4_ = *pfVar5;
                  }
                  fVar38 = pfVar5[1];
                  if (auVar42._0_4_ <= fVar38) {
                    fVar38 = auVar42._0_4_;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar37) {
                    fVar37 = 88.37626;
                  }
                  fVar37 = expf((float)(-(uint)(fVar37 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar37 < -88.37626) & (uint)-fVar37));
                  pvVar25 = local_180;
                  pvVar28 = local_1c0;
                  pvVar31 = local_1b8;
                  iVar32 = (int)local_178;
                  fVar38 = 1.0 / (fVar37 + 1.0);
                  break;
                case 5:
                  local_b8 = auVar42;
                  fVar37 = expf(fVar37);
                  fVar37 = logf(fVar37 + 1.0);
                  fVar37 = tanhf(fVar37);
                  pvVar25 = local_180;
                  pvVar28 = local_1c0;
                  pvVar31 = local_1b8;
                  iVar32 = (int)local_178;
                  fVar38 = fVar37 * (float)local_b8._0_4_;
                  break;
                case 6:
                  fVar1 = *pfVar5;
                  fVar39 = -pfVar5[1] / fVar1;
                  fVar38 = 0.0;
                  if (fVar39 <= fVar37) {
                    if (fVar39 + 1.0 / fVar1 < fVar37) goto switchD_004db89c_default;
                    fVar38 = (fVar1 * fVar37 + pfVar5[1]) * fVar37;
                  }
                }
                *(float *)((long)pvVar31 + lVar20 * 4) = fVar38;
              }
              pvVar31 = (void *)((long)pvVar31 + local_150 * 4);
              uVar21 = local_138;
              iVar15 = local_c8._0_4_;
              iVar14 = (int)local_190 + 1;
            }
          }
          pvVar35 = (void *)((long)pvVar35 + __n * 4);
        }
      }
      else {
        uVar19 = (long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | (ulong)local_198 & 0xffffffff)
                 / (long)(int)uVar2;
        uVar16 = (long)this->num_output / (long)(int)uVar2;
        iVar15 = (int)uVar19;
        uVar36 = 0;
        if (0 < (int)uVar12) {
          uVar36 = (ulong)uVar12;
        }
        uVar21 = 0;
        if (0 < iVar15) {
          uVar21 = uVar19 & 0xffffffff;
        }
        local_124 = (int)uVar16;
        local_150 = 0;
        if (0 < local_124) {
          local_150 = uVar16 & 0xffffffff;
        }
        local_a0 = (long)iVar15;
        local_a8 = (long)local_124;
        local_188 = 0;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        local_98 = (ulong)uVar2;
        local_124 = local_124 * iVar15 * uVar12;
        local_160 = (void *)((long)(int)(iVar15 * uVar12) << 2);
        iVar15 = 0;
        uVar19 = 0;
        while (uVar19 != local_98) {
          local_168 = (void *)CONCAT44(local_168._4_4_,iVar15);
          local_198 = (void *)(local_120->cstep * local_120->elemsize);
          local_158 = uVar19 * local_a8;
          uVar2 = local_120->w;
          local_140 = (long)(int)uVar2;
          lVar33 = uVar19 * local_a0;
          uVar16 = 0;
          if (0 < (int)uVar2) {
            uVar16 = (ulong)uVar2;
          }
          iVar14 = local_120->h;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          local_130 = (void *)CONCAT44(local_130._4_4_,iVar14);
          iVar14 = local_120->d;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          local_148 = CONCAT44(local_148._4_4_,iVar14);
          local_1a0 = local_120->data;
          local_1c0 = (void *)((long)iVar15 * 4 + (long)(this->weight_data).data);
          local_170 = uVar19;
          for (uVar17 = 0; uVar17 != local_150; uVar17 = uVar17 + 1) {
            local_b8._0_8_ = uVar17 + local_158;
            local_1d0 = (void *)((long)local_198 * (uVar17 + local_158) + (long)local_1a0);
            local_138 = uVar17;
            for (iVar15 = 0; iVar15 != (int)local_148; iVar15 = iVar15 + 1) {
              local_1b0 = (void *)CONCAT44(local_1b0._4_4_,iVar15);
              iVar14 = 0;
              while (iVar14 != (int)local_130) {
                local_1a8 = CONCAT44(local_1a8._4_4_,iVar14);
                local_1b8 = (void *)CONCAT44(local_1b8._4_4_,this->bias_term);
                local_180 = (this->bias_data).data;
                local_190 = (float *)(this->activation_params).data;
                local_178 = (ulong)(this->activation_type - 1);
                uVar19 = 0;
                while( true ) {
                  if (uVar19 == uVar16) break;
                  if ((int)local_1b8 == 0) {
                    auVar41 = ZEXT812(0);
                  }
                  else {
                    auVar41._4_8_ = 0;
                    auVar41._0_4_ = *(uint *)((long)local_180 + local_b8._0_8_ * 4);
                  }
                  auVar43._12_4_ = 0;
                  auVar43._0_12_ = auVar41;
                  lVar18 = (long)local_118.w *
                           CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
                  pvVar35 = local_1c0;
                  for (uVar17 = 0; fVar37 = auVar43._0_4_, uVar17 != uVar21; uVar17 = uVar17 + 1) {
                    for (uVar29 = 0; uVar36 != uVar29; uVar29 = uVar29 + 1) {
                      auVar43._0_4_ =
                           auVar43._0_4_ +
                           *(float *)((long)pvVar35 + uVar29 * 4) *
                           *(float *)((long)local_118.data +
                                     (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar29] * 4 +
                                     (uVar17 + lVar33) *
                                     local_118.cstep *
                                     CONCAT44(local_118.elemsize._4_4_,
                                              (undefined4)local_118.elemsize) +
                                     (long)(int)uVar19 * (long)this->stride_w * 4 +
                                     (long)(int)local_1a8 * (long)this->stride_h * lVar18 +
                                     local_118.h * lVar18 *
                                     (long)(int)local_1b0 * (long)this->stride_d);
                    }
                    pvVar35 = (void *)((long)pvVar35 + __n * 4);
                  }
                  if ((uint)local_178 < 6) {
                    switch((long)&switchD_004dbcfd::switchdataD_00545814 +
                           (long)(int)(&switchD_004dbcfd::switchdataD_00545814)[local_178]) {
                    case 0x4dbcff:
                      if (fVar37 <= 0.0) {
                        auVar7._12_4_ = 0;
                        auVar7._0_12_ = auVar43._4_12_;
                        auVar43 = auVar7 << 0x20;
                      }
                      goto LAB_004dbd07;
                    case 0x4dbd0f:
                      local_c8 = auVar43;
                      fVar37 = expf(fVar37);
                      fVar37 = logf(fVar37 + 1.0);
                      fVar37 = tanhf(fVar37);
                      fVar38 = fVar37 * (float)local_c8._0_4_;
                      break;
                    case 0x4dbd4b:
                      if (fVar37 <= *local_190) {
                        auVar43._0_4_ = *local_190;
                      }
                      fVar38 = local_190[1];
                      if (auVar43._0_4_ <= fVar38) {
                        fVar38 = auVar43._0_4_;
                      }
                      break;
                    case 0x4dbd6a:
                      if (88.37626 <= fVar37) {
                        fVar37 = 88.37626;
                      }
                      fVar37 = expf((float)(-(uint)(fVar37 < -88.37626) & 0x42b0c0a5 |
                                           ~-(uint)(fVar37 < -88.37626) & (uint)-fVar37));
                      fVar38 = 1.0 / (fVar37 + 1.0);
                      break;
                    case 0x4dbdbe:
                      fVar38 = (float)(~-(uint)(0.0 < fVar37) & (uint)*local_190 |
                                      -(uint)(0.0 < fVar37) & 0x3f800000) * fVar37;
                      break;
                    case 0x4dbde9:
                      fVar1 = *local_190;
                      fVar39 = -local_190[1] / fVar1;
                      fVar38 = 0.0;
                      if (fVar39 <= fVar37) {
                        if (fVar39 + 1.0 / fVar1 < fVar37) goto LAB_004dbd07;
                        fVar38 = (fVar1 * fVar37 + local_190[1]) * fVar37;
                      }
                    }
                  }
                  else {
LAB_004dbd07:
                    fVar38 = auVar43._0_4_;
                  }
                  *(float *)((long)local_1d0 + uVar19 * 4) = fVar38;
                  uVar19 = uVar19 + 1;
                }
                local_1d0 = (void *)((long)local_1d0 + local_140 * 4);
                uVar17 = local_138;
                iVar15 = (int)local_1b0;
                iVar14 = (int)local_1a8 + 1;
              }
            }
            local_1c0 = (void *)((long)local_1c0 + (long)local_160);
          }
          iVar15 = (int)local_168 + local_124;
          uVar19 = local_170 + 1;
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  piVar8 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return (int)local_188;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}